

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O3

void ans_smsb_decompress(uint32_t *dst,size_t to_decode,uint8_t *cSrc,size_t cSrcSize)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  array<unsigned_long,_4UL> states;
  ans_smsb_decode ans_frame;
  undefined1 (*local_a8) [32];
  undefined1 local_a0 [32];
  ans_smsb_decode local_80;
  
  ans_smsb_decode::load(&local_80,cSrc);
  local_a8 = (undefined1 (*) [32])(cSrc + (cSrcSize - 0x20));
  uVar4 = to_decode & 0xfffffffffffffffc;
  auVar1 = vpermq_avx2(*local_a8,0x1b);
  auVar2._8_8_ = local_80.lower_bound;
  auVar2._0_8_ = local_80.lower_bound;
  auVar2._16_8_ = local_80.lower_bound;
  auVar2._24_8_ = local_80.lower_bound;
  local_a0 = vpaddq_avx512vl(auVar1,auVar2);
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      uVar3 = ans_smsb_decode::decode_sym(&local_80,(uint64_t *)local_a0,(uint8_t **)&local_a8);
      dst[uVar5] = uVar3;
      uVar3 = ans_smsb_decode::decode_sym
                        (&local_80,(uint64_t *)(local_a0 + 8),(uint8_t **)&local_a8);
      dst[uVar5 + 1] = uVar3;
      uVar3 = ans_smsb_decode::decode_sym
                        (&local_80,(uint64_t *)(local_a0 + 0x10),(uint8_t **)&local_a8);
      dst[uVar5 + 2] = uVar3;
      uVar3 = ans_smsb_decode::decode_sym
                        (&local_80,(uint64_t *)(local_a0 + 0x18),(uint8_t **)&local_a8);
      dst[uVar5 + 3] = uVar3;
      uVar5 = uVar5 + 4;
    } while (uVar4 != uVar5);
  }
  if (uVar4 != to_decode) {
    do {
      uVar3 = ans_smsb_decode::decode_sym
                        (&local_80,(uint64_t *)(local_a0 + 0x18),(uint8_t **)&local_a8);
      dst[uVar4] = uVar3;
      uVar4 = uVar4 + 1;
    } while (to_decode != uVar4);
  }
  if (local_80.table.super__Vector_base<dec_entry_smsb,_std::allocator<dec_entry_smsb>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.table.
                    super__Vector_base<dec_entry_smsb,_std::allocator<dec_entry_smsb>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.table.
                          super__Vector_base<dec_entry_smsb,_std::allocator<dec_entry_smsb>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.table.
                          super__Vector_base<dec_entry_smsb,_std::allocator<dec_entry_smsb>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ans_smsb_decompress(
    uint32_t* dst, size_t to_decode, const uint8_t* cSrc, size_t cSrcSize)
{
    const uint32_t num_states = 4;
    auto in_u8 = reinterpret_cast<const uint8_t*>(cSrc);
    auto ans_frame = ans_smsb_decode::load(in_u8);
    in_u8 += cSrcSize;

    std::array<uint64_t, num_states> states;

    for (uint32_t i = 0; i < num_states; i++) {
        states[i] = ans_frame.init_state(in_u8);
    }

    size_t cur_idx = 0;
    auto out_u32 = reinterpret_cast<uint32_t*>(dst);
    size_t fast_decode = to_decode - (to_decode % num_states);
    while (cur_idx != fast_decode) {
        out_u32[cur_idx] = ans_frame.decode_sym(states[0], in_u8);
        out_u32[cur_idx + 1] = ans_frame.decode_sym(states[1], in_u8);
        out_u32[cur_idx + 2] = ans_frame.decode_sym(states[2], in_u8);
        out_u32[cur_idx + 3] = ans_frame.decode_sym(states[3], in_u8);
        cur_idx += num_states;
    }
    while (cur_idx != to_decode) {
        out_u32[cur_idx++]
            = ans_frame.decode_sym(states[num_states - 1], in_u8);
    }
}